

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ground_plane.cpp
# Opt level: O0

ON_2dVector __thiscall ON_GroundPlane::CImpl::TextureSize(CImpl *this)

{
  wchar_t *path_to_node;
  ON_XMLVariant local_220;
  ON_XMLVariant local_128;
  ON_2dPoint local_30;
  CImpl *local_20;
  CImpl *this_local;
  
  local_20 = this;
  path_to_node = XMLPath();
  ::ON_XMLVariant::ON_XMLVariant(&local_220,&ON_nil_uuid);
  ON_InternalXMLImpl::GetParameter
            (&local_128,&this->super_ON_InternalXMLImpl,path_to_node,L"texture-size",&local_220);
  local_30 = ::ON_XMLVariant::As2dPoint(&local_128);
  ON_2dVector::ON_2dVector((ON_2dVector *)&this_local,&local_30);
  ::ON_XMLVariant::~ON_XMLVariant(&local_128);
  ::ON_XMLVariant::~ON_XMLVariant(&local_220);
  return _this_local;
}

Assistant:

ON_2dVector TextureSize(void)    const { return ON_2dVector(GetParameter(XMLPath(), ON_RDK_GP_TEXTURE_SIZE, ON_nil_uuid).As2dPoint()); }